

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  size_type sVar1;
  void *pvVar2;
  size_type sVar3;
  long in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  long *in_RDI;
  ulong in_R8;
  EXRHeader *exr_header;
  size_t i;
  int ret;
  bool empty_header;
  string err_str;
  HeaderInfo info;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  size_t marker_size;
  uchar *marker;
  size_t in_stack_000003f0;
  uchar *in_stack_000003f8;
  string *in_stack_00000400;
  EXRVersion *in_stack_00000408;
  bool *in_stack_00000410;
  HeaderInfo *in_stack_00000418;
  char **in_stack_fffffffffffffe08;
  HeaderInfo *in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int iVar4;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *paVar5;
  HeaderInfo *in_stack_fffffffffffffe48;
  EXRHeader *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type local_1a0;
  allocator<char> local_191;
  string local_190 [36];
  int local_16c;
  int local_168;
  byte local_161;
  string local_160 [32];
  allocator<char> local_140 [100];
  int local_dc;
  uint local_c8;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> local_c0;
  long local_a8;
  long local_a0;
  allocator<char> local_91;
  string local_90 [55];
  undefined1 local_59 [41];
  ulong local_30;
  long local_20;
  undefined4 *local_18;
  long *local_10;
  int local_4;
  
  if ((((in_RCX == 0) || (in_RDI == (long *)0x0)) || (in_RSI == (undefined4 *)0x0)) || (in_RDX == 0)
     ) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)(local_59 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_59);
    local_4 = -3;
  }
  else if (in_R8 < 8) {
    paVar5 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50,(char *)paVar5,in_stack_fffffffffffffe40);
    tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    local_4 = -4;
  }
  else {
    local_a0 = in_RCX + 8;
    local_a8 = in_R8 - 8;
    local_30 = in_R8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)0x17f589);
    while( true ) {
      paVar5 = local_140;
      tinyexr::HeaderInfo::HeaderInfo(in_stack_fffffffffffffe10);
      tinyexr::HeaderInfo::clear(in_stack_fffffffffffffe10);
      std::__cxx11::string::string(local_160);
      local_161 = 0;
      local_168 = tinyexr::ParseEXRHeader
                            (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400
                             ,in_stack_000003f8,in_stack_000003f0);
      if (local_168 == 0) {
        if ((local_161 & 1) == 0) {
          if (local_dc == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,paVar5);
            tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
            std::__cxx11::string::~string(local_190);
            std::allocator<char>::~allocator(&local_191);
            local_4 = -4;
            local_16c = 1;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18);
            local_a0 = local_a0 + (ulong)local_c8;
            local_30 = local_30 - local_c8;
            local_16c = 0;
          }
        }
        else {
          local_a0 = local_a0 + 1;
          local_16c = 2;
        }
      }
      else {
        tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_4 = local_168;
        local_16c = 1;
      }
      std::__cxx11::string::~string(local_160);
      tinyexr::HeaderInfo::~HeaderInfo(in_stack_fffffffffffffe10);
      if (local_16c != 0) break;
      in_stack_fffffffffffffe24 = 0;
    }
    iVar4 = local_16c;
    if (local_16c == 2) {
      sVar1 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                        (&local_c0);
      pvVar2 = malloc(sVar1 << 3);
      *local_10 = (long)pvVar2;
      local_1a0 = 0;
      while (sVar1 = local_1a0,
            sVar3 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                              (&local_c0), sVar1 < sVar3) {
        pvVar2 = malloc(0x88);
        std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::operator[]
                  (&local_c0,local_1a0);
        tinyexr::ConvertHeader(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        *(undefined4 *)((long)pvVar2 + 0x38) = *(undefined4 *)(local_20 + 4);
        *(void **)(*local_10 + local_1a0 * 8) = pvVar2;
        local_1a0 = local_1a0 + 1;
      }
      sVar1 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                        (&local_c0);
      *local_18 = (int)sVar1;
      local_4 = 0;
      local_16c = 1;
    }
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)
               CONCAT44(iVar4,in_stack_fffffffffffffe20));
  }
  return local_4;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}